

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatingCodec.cc
# Opt level: O3

ProductionPtr __thiscall
avro::parsing::ValidatingGrammarGenerator::doGenerate
          (ValidatingGrammarGenerator *this,NodePtr *n,
          map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
          *m)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  ValidatingGrammarGenerator VVar3;
  int iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *pvVar7;
  size_type __n;
  undefined8 uVar8;
  _func_int **pp_Var9;
  undefined4 extraout_var;
  mapped_type *pmVar10;
  undefined8 *puVar11;
  _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *in_RCX;
  _Base_ptr p_Var12;
  shared_count sVar13;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  sp_counted_base *extraout_RDX_01;
  sp_counted_base *extraout_RDX_02;
  sp_counted_base *extraout_RDX_03;
  ulong uVar14;
  shared_count *this_00;
  ProductionPtr *result;
  long lVar15;
  ulong uVar16;
  sp_counted_base *__x;
  bool bVar17;
  type tVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  pVar19;
  ProductionPtr PVar20;
  ProductionPtr pp;
  shared_ptr<avro::NodeSymbolic> ns;
  NodePtr nn;
  undefined1 local_98 [32];
  Symbol local_78;
  key_type *local_68;
  undefined1 local_60 [8];
  any local_58;
  _Alloc_hider local_50;
  int local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  pvVar7 = *(vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> **)
            &(m->_M_t)._M_impl;
  local_68 = (key_type *)m;
  switch(*(undefined4 *)
          &(pvVar7->
           super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
           _M_impl.super__Vector_impl_data._M_finish) {
  case 0:
    local_78.kind_ = 1;
    local_98._0_4_ = sString;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 1:
    local_78.kind_ = 1;
    local_98._0_4_ = sBytes;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 2:
    local_78.kind_ = 1;
    local_98._0_4_ = sInt;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 3:
    local_78.kind_ = 1;
    local_98._0_4_ = sLong;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 4:
    local_78.kind_ = 1;
    local_98._0_4_ = sFloat;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 5:
    local_78.kind_ = 1;
    local_98._0_4_ = sDouble;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 6:
    local_78.kind_ = 1;
    local_98._0_4_ = sBool;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 7:
    local_78.kind_ = 1;
    local_98._0_4_ = sNull;
    local_98._8_8_ = (placeholder *)0x0;
    tVar18 = boost::
             make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                       ((boost *)this,(int *)&local_78,(Symbol *)local_98);
    sVar13 = tVar18.pn.pi_;
    break;
  case 8:
    local_50._M_p = (pointer)this;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    pVar19 = std::
             _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
             ::equal_range(in_RCX,local_68);
    std::
    _Rb_tree<boost::shared_ptr<avro::Node>,_std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
    ::_M_erase_aux(in_RCX,(_Base_ptr)pVar19.first._M_node,(_Base_ptr)pVar19.second._M_node);
    aStack_40._8_8_ = n;
    iVar4 = (*local_68->px->_vptr_Node[4])();
    if (CONCAT44(extraout_var,iVar4) != 0) {
      uVar14 = 0;
      do {
        iVar5 = (*local_68->px->_vptr_Node[5])(local_68->px,uVar14 & 0xffffffff);
        (*(code *)**(undefined8 **)aStack_40._8_8_)(local_98,aStack_40._8_8_,iVar5,in_RCX);
        __x = ((shared_count *)(local_98._0_8_ + 8))->pi_;
        lVar15 = (long)__x -
                 (long)(((_Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                          *)local_98._0_8_)->_M_impl).super__Vector_impl_data._M_start >> 4;
        if (0 < lVar15) {
          VVar3._vptr_ValidatingGrammarGenerator = *(_func_int ***)local_50._M_p;
          uVar16 = lVar15 + 1;
          do {
            __x = __x + -1;
            std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                      ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                       VVar3._vptr_ValidatingGrammarGenerator,(value_type *)__x);
            uVar16 = uVar16 - 1;
          } while (1 < uVar16);
        }
        boost::detail::shared_count::~shared_count((shared_count *)(local_98 + 8));
        uVar14 = uVar14 + 1;
      } while (uVar14 != CONCAT44(extraout_var,iVar4));
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<avro::parsing::Symbol*,std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
              (**(_func_int ***)local_50._M_p,(*(_func_int ***)local_50._M_p)[1]);
    pmVar10 = std::
              map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
              ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                            *)in_RCX,local_68);
    this = (ValidatingGrammarGenerator *)local_50._M_p;
    goto LAB_00190c00;
  case 9:
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    pvVar7 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    pp_Var9 = (_func_int **)
              (**(code **)(**(long **)&((_Rep_type *)&local_68->px)->_M_impl + 0x38))();
    local_98._0_4_ = sSizeCheck;
    local_98._8_8_ = operator_new(0x10);
    ((placeholder *)local_98._8_8_)->_vptr_placeholder = (_func_int **)&PTR__placeholder_001d01b8;
    ((placeholder *)(local_98._8_8_ + 8))->_vptr_placeholder = pp_Var9;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar7,(Symbol *)local_98);
    if ((placeholder *)local_98._8_8_ != (placeholder *)0x0) {
      (*(*(_func_int ***)local_98._8_8_)[1])();
    }
    local_98._0_4_ = 0xe;
    local_98._8_8_ = (sp_counted_base *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)local_98);
    if ((sp_counted_base *)local_98._8_8_ != (sp_counted_base *)0x0) {
      (*(*(_func_int ***)local_98._8_8_)[1])();
    }
    pmVar10 = std::
              map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
              ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                            *)in_RCX,local_68);
    goto LAB_00190c00;
  case 10:
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    local_98._0_4_ = sArrayEnd;
    local_98._8_8_ = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)local_98);
    if ((placeholder *)local_98._8_8_ != (placeholder *)0x0) {
      (*(*(_func_int ***)local_98._8_8_)[1])();
    }
    pvVar7 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    plVar2 = *(long **)&((_Rep_type *)&local_68->px)->_M_impl;
    uVar8 = (**(code **)(*plVar2 + 0x28))(plVar2,0);
    (*(code *)n->px->_vptr_Node)(&local_78,n,uVar8);
    Symbol::repeater((Symbol *)local_98,(ProductionPtr *)&local_78,true);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar7,(Symbol *)local_98);
    if ((placeholder *)local_98._8_8_ != (placeholder *)0x0) {
      (*(*(_func_int ***)local_98._8_8_)[1])();
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_78.extra_);
    local_98._0_4_ = sArrayStart;
    local_98._8_8_ = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)local_98);
    sVar13.pi_ = extraout_RDX_00;
    break;
  case 0xb:
    uVar8 = (*(code *)(pvVar7->
                      super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                      )._M_impl.super__Vector_impl_data._M_start[2].extra_.content)(pvVar7,1);
    (*(code *)n->px->_vptr_Node)(local_98,n,uVar8);
    pvVar7 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             operator_new(0x18);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::vector
              (pvVar7,(vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
                      local_98._0_8_);
    boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
    shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
              ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                *)&local_78,pvVar7);
    local_60._0_4_ = sString;
    local_58.content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               local_78._0_8_,(Symbol *)local_60);
    if (local_58.content != (placeholder *)0x0) {
      (*(local_58.content)->_vptr_placeholder[1])();
    }
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    local_60._0_4_ = sMapEnd;
    local_58.content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)local_60);
    if (local_58.content != (placeholder *)0x0) {
      (*(local_58.content)->_vptr_placeholder[1])();
    }
    pvVar7 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    Symbol::repeater((Symbol *)local_60,(ProductionPtr *)&local_78,false);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar7,(Symbol *)local_60);
    if (local_58.content != (placeholder *)0x0) {
      (*(local_58.content)->_vptr_placeholder[1])();
    }
    local_60._0_4_ = sMapStart;
    local_58.content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)local_60);
    if ((_Base_ptr)local_58.content != (_Base_ptr)0x0) {
      (*(local_58.content)->_vptr_placeholder[1])();
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_78.extra_);
    this_00 = (shared_count *)(local_98 + 8);
    goto LAB_00190c92;
  case 0xc:
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (placeholder *)0x0;
    local_98._16_8_ = (pointer)0x0;
    __n = (**(code **)((pvVar7->
                       super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                       )._M_impl.super__Vector_impl_data._M_start + 2))(pvVar7);
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::reserve((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               *)local_98,__n);
    local_50._M_p = (pointer)this;
    if (__n != 0) {
      uVar14 = 0;
      do {
        plVar2 = *(long **)&((_Rep_type *)&local_68->px)->_M_impl;
        uVar8 = (**(code **)(*plVar2 + 0x28))(plVar2,uVar14 & 0xffffffff);
        (*(code *)n->px->_vptr_Node)
                  ((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)&local_78,n,uVar8);
        std::
        vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
        ::
        emplace_back<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                  ((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
                    *)local_98,
                   (shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                    *)&local_78);
        boost::detail::shared_count::~shared_count((shared_count *)&local_78.extra_);
        uVar14 = uVar14 + 1;
      } while (__n != uVar14);
    }
    this = (ValidatingGrammarGenerator *)local_50._M_p;
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    VVar3._vptr_ValidatingGrammarGenerator = this->_vptr_ValidatingGrammarGenerator;
    Symbol::alternative(&local_78,
                        (vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                         *)local_98);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               VVar3._vptr_ValidatingGrammarGenerator,&local_78);
    if ((sp_counted_base *)local_78.extra_.content != (sp_counted_base *)0x0) {
      (*(local_78.extra_.content)->_vptr_placeholder[1])();
    }
    local_78.kind_ = 0xf;
    local_78.extra_.content = (placeholder *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,&local_78);
    if ((sp_counted_base *)local_78.extra_.content != (sp_counted_base *)0x0) {
      (*(local_78.extra_.content)->_vptr_placeholder[1])();
    }
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::~vector((vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               *)local_98);
    sVar13.pi_ = extraout_RDX;
    goto LAB_00190c97;
  case 0xd:
    boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
    pvVar7 = (vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             this->_vptr_ValidatingGrammarGenerator;
    iVar4 = (**(code **)(**(long **)&((_Rep_type *)&local_68->px)->_M_impl + 0x50))();
    local_98._0_4_ = sSizeCheck;
    local_98._8_8_ = operator_new(0x10);
    ((placeholder *)local_98._8_8_)->_vptr_placeholder = (_func_int **)&PTR__placeholder_001d01b8;
    ((placeholder *)(local_98._8_8_ + 8))->_vptr_placeholder = (_func_int **)(long)iVar4;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>(pvVar7,(Symbol *)local_98);
    if ((placeholder *)local_98._8_8_ != (placeholder *)0x0) {
      (*(*(_func_int ***)local_98._8_8_)[1])();
    }
    local_98._0_4_ = 0xd;
    local_98._8_8_ = (sp_counted_base *)0x0;
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::
    emplace_back<avro::parsing::Symbol>
              ((vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
               this->_vptr_ValidatingGrammarGenerator,(Symbol *)local_98);
    if ((sp_counted_base *)local_98._8_8_ != (sp_counted_base *)0x0) {
      (*(*(_func_int ***)local_98._8_8_)[1])();
    }
    pmVar10 = std::
              map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
              ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                            *)in_RCX,local_68);
LAB_00190c00:
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator=(pmVar10,(shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                       *)this);
    sVar13.pi_ = extraout_RDX_02;
    goto LAB_00190c97;
  case 0xe:
    local_78.extra_.content = *(placeholder **)&(m->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if ((sp_counted_base *)local_78.extra_.content != (sp_counted_base *)0x0) {
      LOCK();
      ((sp_counted_base *)local_78.extra_.content)->use_count_ =
           ((sp_counted_base *)local_78.extra_.content)->use_count_ + 1;
      UNLOCK();
    }
    this_00 = (shared_count *)&local_78.extra_;
    local_78._0_8_ = pvVar7;
    NodeSymbolic::getNode((NodeSymbolic *)local_60);
    p_Var12 = (in_RCX->_M_impl).super__Rb_tree_header._M_header._M_parent;
    if (p_Var12 == (_Base_ptr)0x0) {
LAB_00190c0d:
      local_48[0] = 0;
      local_48[1] = 0;
      aStack_40._M_allocated_capacity = 0;
      pmVar10 = std::
                map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                ::operator[]((map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
                              *)in_RCX,(key_type *)local_60);
      local_48[0] = 0;
      local_48[1] = 0;
      aStack_40._M_allocated_capacity = 0;
      local_98._0_8_ = pmVar10->px;
      local_98._8_8_ = (pmVar10->pn).pi_;
      pmVar10->px = (element_type *)0x0;
      (pmVar10->pn).pi_ = (sp_counted_base *)0x0;
      boost::detail::shared_count::~shared_count((shared_count *)(local_98 + 8));
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_40._M_allocated_capacity);
      local_48[0] = 1;
      Symbol::placeholder<boost::shared_ptr<avro::Node>>
                ((Symbol *)local_98,(shared_ptr<avro::Node> *)local_60);
      boost::
      make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>,int,avro::parsing::Symbol>
                ((boost *)this,local_48,(Symbol *)local_98);
      if ((sp_counted_base *)local_98._8_8_ != (sp_counted_base *)0x0) {
        (*(*(_func_int ***)local_98._8_8_)[1])();
      }
    }
    else {
      p_Var1 = &(in_RCX->_M_impl).super__Rb_tree_header;
      p_Var6 = &p_Var1->_M_header;
      do {
        bVar17 = p_Var12[1]._M_parent < local_58.content;
        if (!bVar17) {
          p_Var6 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[bVar17];
      } while (p_Var12 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var6 == p_Var1) || (local_58.content < p_Var6[1]._M_parent)) ||
         (p_Var6[1]._M_left == (_Base_ptr)0x0)) goto LAB_00190c0d;
      this->_vptr_ValidatingGrammarGenerator = (_func_int **)p_Var6[1]._M_left;
      p_Var12 = p_Var6[1]._M_right;
      this[1]._vptr_ValidatingGrammarGenerator = (_func_int **)p_Var12;
      if (p_Var12 != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&p_Var12->_M_parent = *(int *)&p_Var12->_M_parent + 1;
        UNLOCK();
      }
    }
    boost::detail::shared_count::~shared_count((shared_count *)&local_58);
LAB_00190c92:
    boost::detail::shared_count::~shared_count(this_00);
    sVar13.pi_ = extraout_RDX_03;
    goto LAB_00190c97;
  default:
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Unknown node type","");
    std::runtime_error::runtime_error((runtime_error *)(puVar11 + 1),(string *)local_98);
    *puVar11 = 0x1cc910;
    puVar11[1] = 0x1cc940;
    __cxa_throw(puVar11,&Exception::typeinfo,Exception::~Exception);
  }
  if ((placeholder *)local_98._8_8_ != (placeholder *)0x0) {
    (*(*(_func_int ***)local_98._8_8_)[1])();
    sVar13.pi_ = extraout_RDX_01;
  }
LAB_00190c97:
  PVar20.pn.pi_ = sVar13.pi_;
  PVar20.px = (element_type *)this;
  return PVar20;
}

Assistant:

ProductionPtr ValidatingGrammarGenerator::doGenerate(const NodePtr& n,
    map<NodePtr, ProductionPtr> &m) {
    switch (n->type()) {
    case AVRO_NULL:
        return make_shared<Production>(1, Symbol::nullSymbol());
    case AVRO_BOOL:
        return make_shared<Production>(1, Symbol::boolSymbol());
    case AVRO_INT:
        return make_shared<Production>(1, Symbol::intSymbol());
    case AVRO_LONG:
        return make_shared<Production>(1, Symbol::longSymbol());
    case AVRO_FLOAT:
        return make_shared<Production>(1, Symbol::floatSymbol());
    case AVRO_DOUBLE:
        return make_shared<Production>(1, Symbol::doubleSymbol());
    case AVRO_STRING:
        return make_shared<Production>(1, Symbol::stringSymbol());
    case AVRO_BYTES:
        return make_shared<Production>(1, Symbol::bytesSymbol());
    case AVRO_FIXED:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::sizeCheckSymbol(n->fixedSize()));
            result->push_back(Symbol::fixedSymbol());
            m[n] = result;
            return result;
        }
    case AVRO_RECORD:
        {
            ProductionPtr result = make_shared<Production>();

            m.erase(n);
            size_t c = n->leaves();
            for (size_t i = 0; i < c; ++i) {
                const NodePtr& leaf = n->leafAt(i);
                ProductionPtr v = doGenerate(leaf, m);
                copy(v->rbegin(), v->rend(), back_inserter(*result));
            }
            reverse(result->begin(), result->end());

            m[n] = result;
            return result;
        }
    case AVRO_ENUM:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::sizeCheckSymbol(n->names()));
            result->push_back(Symbol::enumSymbol());
            m[n] = result;
            return result;
        }
    case AVRO_ARRAY:
        {
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::arrayEndSymbol());
            result->push_back(Symbol::repeater(doGenerate(n->leafAt(0), m), true));
            result->push_back(Symbol::arrayStartSymbol());
            return result;
        }
    case AVRO_MAP:
        {
            ProductionPtr pp = doGenerate(n->leafAt(1), m);
			ProductionPtr v(new Production(*pp));
            v->push_back(Symbol::stringSymbol());
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::mapEndSymbol());
            result->push_back(Symbol::repeater(v, false));
            result->push_back(Symbol::mapStartSymbol());
            return result;
        }
    case AVRO_UNION:
        {
            vector<ProductionPtr> vv;
            size_t c = n->leaves();
            vv.reserve(c);
            for (size_t i = 0; i < c; ++i) {
                vv.push_back(doGenerate(n->leafAt(i), m));
            }
            ProductionPtr result = make_shared<Production>();
            result->push_back(Symbol::alternative(vv));
            result->push_back(Symbol::unionSymbol());
            return result;
        }
    case AVRO_SYMBOLIC:
        {
            shared_ptr<NodeSymbolic> ns = static_pointer_cast<NodeSymbolic>(n);
            NodePtr nn = ns->getNode();
            map<NodePtr, ProductionPtr>::iterator it =
                m.find(nn);
            if (it != m.end() && it->second) {
                return it->second;
            } else {
                m[nn] = ProductionPtr();
                return make_shared<Production>(1, Symbol::placeholder(nn));
            }
        }
    default:
        throw Exception("Unknown node type");
    }
}